

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FractionalSpacingModeCase::iterate
          (FractionalSpacingModeCase *this)

{
  Segment SVar1;
  SpacingMode SVar2;
  RenderContext *pRVar3;
  value_type *pvVar4;
  _Iter_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::MemberPred<std::less<float>,_deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_float>_>
  __comp;
  _Iter_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::MemberPred<std::less<float>,_deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_float>_>
  __comp_00;
  _Iter_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::MemberPred<std::less<float>,_deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_float>_>
  __comp_01;
  pointer pSVar5;
  pointer pfVar6;
  float *pfVar7;
  int iVar8;
  deUint32 dVar9;
  int iVar10;
  deUint32 dVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ObjectTraits *pOVar12;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar13;
  undefined8 *puVar14;
  long *plVar15;
  size_type sVar16;
  ulong uVar17;
  pointer pSVar18;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
  *p_Var19;
  ulong uVar20;
  pointer pLVar21;
  pointer pLVar22;
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>_>
  __first;
  TestError *pTVar23;
  float *pfVar24;
  TestLog *pTVar25;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar26;
  Segment *pSVar27;
  pointer pfVar28;
  Segment *pSVar29;
  char *pcVar30;
  uint uVar31;
  pointer pLVar32;
  int i;
  size_type __n;
  int *piVar33;
  iterator __n_00;
  Segment SVar34;
  Segment SVar35;
  undefined8 uVar36;
  _func_int **__n_01;
  vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
  *this_00;
  undefined1 auVar37 [8];
  uint uVar38;
  pointer pSVar39;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
  *this_01;
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>_>
  __last;
  pointer pLVar40;
  int rangeNdx;
  long lVar41;
  LineData *pLVar42;
  pointer pLVar43;
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>_>
  __last_00;
  bool bVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  vector<float,_std::allocator<float>_> result_2;
  vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
  segmentsB;
  vector<float,_std::allocator<float>_> tessLevelCases;
  vector<float,_std::allocator<float>_> sortedCoords;
  int additionalSegmentLocation;
  float additionalSegmentLength;
  vector<int,_std::allocator<int>_> additionalSegmentLocations;
  vector<float,_std::allocator<float>_> additionalSegmentLengths;
  Result tfResult;
  RandomViewport viewport;
  TFHandler tfHandler;
  string failNote;
  undefined8 in_stack_fffffffffffff958;
  undefined4 uVar48;
  undefined4 uVar50;
  pointer pLVar49;
  float local_694;
  vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
  local_688;
  long lStack_670;
  long local_660;
  vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
  local_658;
  undefined8 uStack_640;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_638;
  float local_62c;
  vector<float,_std::allocator<float>_> local_628;
  LineData *local_608;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
  *local_600;
  long local_5f8;
  vector<float,_std::allocator<float>_> local_5f0;
  undefined8 uStack_5d8;
  FractionalSpacingModeCase *local_5d0;
  float local_5c8;
  undefined4 uStack_5c4;
  long local_5c0;
  Segment local_5b8 [2];
  undefined1 *local_5a8;
  undefined8 local_5a0;
  undefined1 local_598;
  undefined7 uStack_597;
  void *local_588;
  iterator iStack_580;
  int *local_578;
  void *local_568;
  iterator iStack_560;
  float *local_558;
  float local_550;
  vector<float,_std::allocator<float>_> local_548;
  ulong local_530;
  vector<float,_std::allocator<float>_> local_528;
  RandomViewport local_510;
  undefined1 local_500 [8];
  undefined1 local_4f8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0 [6];
  ios_base local_490 [8];
  ios_base local_488 [264];
  RenderContext *local_380;
  ObjectWrapper local_378;
  ObjectWrapper local_360;
  ObjectWrapper local_348;
  undefined1 local_330 [8];
  undefined1 local_328 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320 [6];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  local_638 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar8 = (*pRVar3->_vptr_RenderContext[4])(pRVar3);
  dVar9 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_510,(RenderTarget *)CONCAT44(extraout_var,iVar8),0x10,0x10,dVar9);
  dVar9 = (((this->m_program).m_ptr)->m_program).m_program;
  local_5d0 = this;
  iVar8 = (*pRVar3->_vptr_RenderContext[3])(pRVar3);
  local_5f8 = CONCAT44(extraout_var_00,iVar8);
  local_62c = (float)(**(code **)(local_5f8 + 0xb48))(dVar9,"u_tessLevelOuter1");
  local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  lVar41 = 0;
  do {
    fVar47 = (float)(&Functional::(anonymous_namespace)::FractionalSpacingModeCase::
                      genTessLevelCases()::rangeStarts)[lVar41];
    iVar8 = 0;
    do {
      fVar45 = (float)iVar8 / 10.0 + fVar47;
      local_500._0_4_ = fVar45;
      if (local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (&local_628,
                   (iterator)
                   local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,(float *)local_500);
      }
      else {
        *local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_finish = fVar45;
        local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != 10);
    lVar41 = lVar41 + 1;
  } while (lVar41 != 3);
  iVar8 = 0;
  do {
    local_500._0_4_ = (float)iVar8 + 0.3;
    if (local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (&local_628,
                 (iterator)
                 local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,(float *)local_500);
    }
    else {
      *local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish = (float)iVar8 + 0.3;
      local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    iVar8 = iVar8 + 1;
  } while (iVar8 != 0x3f);
  pfVar24 = local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start + 1;
  pfVar28 = local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pfVar24 !=
      local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish &&
      local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      pfVar7 = pfVar24;
      if (*pfVar24 < *pfVar28 || *pfVar24 == *pfVar28) {
        pfVar7 = pfVar28;
      }
      pfVar28 = pfVar7;
      pfVar24 = pfVar24 + 1;
    } while (pfVar24 !=
             local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  iVar8 = getClampedRoundedTessLevel(local_5d0->m_spacing,*pfVar28);
  local_558 = (float *)0x0;
  local_568 = (void *)0x0;
  iStack_560._M_current = (float *)0x0;
  local_578 = (int *)0x0;
  local_588 = (void *)0x0;
  iStack_580._M_current = (int *)0x0;
  pRVar3 = ((local_5d0->super_TestCase).m_context)->m_renderCtx;
  local_380 = pRVar3;
  iVar10 = (*pRVar3->_vptr_RenderContext[3])(pRVar3);
  pOVar12 = glu::objectTraits(OBJECTTYPE_TRANSFORM_FEEDBACK);
  glu::ObjectWrapper::ObjectWrapper
            (&local_378,(Functions *)CONCAT44(extraout_var_01,iVar10),pOVar12);
  iVar10 = (*pRVar3->_vptr_RenderContext[3])(pRVar3);
  pOVar12 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&local_360,(Functions *)CONCAT44(extraout_var_02,iVar10),pOVar12);
  iVar10 = (*pRVar3->_vptr_RenderContext[3])(pRVar3);
  pOVar12 = glu::objectTraits(OBJECTTYPE_QUERY);
  glu::ObjectWrapper::ObjectWrapper
            (&local_348,(Functions *)CONCAT44(extraout_var_03,iVar10),pOVar12);
  iVar10 = (*local_380->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_04,iVar10) + 0x40))(0x8c8e,local_360.m_object);
  (**(code **)(CONCAT44(extraout_var_04,iVar10) + 0x150))(0x8c8e,(long)(iVar8 * 4 + 0x10),0,0x88e9);
  lVar41 = local_5f8;
  (**(code **)(local_5f8 + 0x1a00))(local_510.x,local_510.y,local_510.width,local_510.height);
  (**(code **)(lVar41 + 0x1680))(dVar9);
  __n_00._M_current = (int *)&DAT_00000001;
  (**(code **)(lVar41 + 0xfd8))(0x8e72);
  if (0 < (int)((ulong)((long)local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2)) {
    lVar41 = 0;
    do {
      lVar13 = local_5f8;
      fVar47 = local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[lVar41];
      local_660 = lVar41;
      (**(code **)(local_5f8 + 0x14e0))(local_62c);
      dVar11 = (**(code **)(lVar13 + 0x800))();
      glu::checkError(dVar11,"Setup failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                      ,0x8cd);
      iVar8 = (*local_380->_vptr_RenderContext[3])();
      lVar41 = CONCAT44(extraout_var_05,iVar8);
      (**(code **)(lVar41 + 0xd0))(0x8e22,local_378.m_object);
      (**(code **)(lVar41 + 0x40))(0x8c8e,local_360.m_object);
      (**(code **)(lVar41 + 0x48))(0x8c8e,0,local_360.m_object);
      (**(code **)(lVar41 + 0x20))(0x8c88,local_348.m_object);
      (**(code **)(lVar41 + 0x30))(0);
      local_500 = (undefined1  [8])0x100000007;
      local_4f8._0_4_ = 3;
      local_4f0[0]._M_allocated_capacity = (qpTestLog *)0x0;
      glu::draw(local_380,dVar9,0,(VertexArrayBinding *)0x0,(PrimitiveList *)local_500,
                (DrawUtilCallback *)0x0);
      dVar11 = (**(code **)(lVar41 + 0x800))();
      glu::checkError(dVar11,"Draw failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                      ,0x15e);
      (**(code **)(lVar41 + 0x638))();
      (**(code **)(lVar41 + 0x628))(0x8c88);
      local_500._0_4_ = 0xffffffff;
      (**(code **)(lVar41 + 0xa20))(local_348.m_object,0x8866,local_500);
      uVar48 = local_500._0_4_;
      __n = (size_type)(int)local_500._0_4_;
      if (__n == 0xffffffffffffffff) {
        pTVar23 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar23,(char *)0x0,"result != (deUint32)-1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                   ,0x104);
        __cxa_throw(pTVar23,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      std::vector<float,_std::allocator<float>_>::vector(&local_528,__n,(allocator_type *)local_500)
      ;
      pfVar28 = local_528.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar13 = (**(code **)(lVar41 + 0xd00))(0x8c8e,0,(long)(uVar48 * 4),1);
      dVar11 = (**(code **)(lVar41 + 0x800))();
      local_5a8 = &local_598;
      local_5a0 = 0;
      local_598 = 0;
      puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_5a8);
      local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
      pfVar24 = (float *)(puVar14 + 2);
      if ((pointer *)*puVar14 == (pointer *)pfVar24) {
        local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = *(pointer *)pfVar24;
        uStack_5d8 = puVar14[3];
      }
      else {
        local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = *(pointer *)pfVar24;
        local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)*puVar14;
      }
      local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)puVar14[1];
      *puVar14 = pfVar24;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      glu::getBufferTargetName(0x8c8e);
      puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_5f0);
      local_658.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&local_658.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pSVar39 = (pointer)(puVar14 + 2);
      if ((pointer)*puVar14 == pSVar39) {
        local_658.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pSVar39;
        uStack_640 = puVar14[3];
      }
      else {
        local_658.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pSVar39;
        local_658.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar14;
      }
      local_658.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar14[1];
      *puVar14 = pSVar39;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_658);
      local_688.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&local_688.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pSVar29 = (Segment *)(plVar15 + 2);
      if ((Segment *)*plVar15 == pSVar29) {
        local_688.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pSVar29;
        lStack_670 = plVar15[3];
      }
      else {
        local_688.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pSVar29;
        local_688.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_start = (Segment *)*plVar15;
      }
      local_688.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar15[1];
      *plVar15 = (long)pSVar29;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_500);
      std::ostream::operator<<((ostringstream *)local_500,uVar48 * 4);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_500);
      std::ios_base::~ios_base(local_490);
      SVar34.index = 0xf;
      SVar34.length = 0.0;
      if (local_688.
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&local_688.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        SVar34 = (Segment)local_688.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      SVar1 = (Segment)((long)&(local_688.
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->index + local_5c0);
      if ((ulong)SVar34 < (ulong)SVar1) {
        SVar35.index = 0xf;
        SVar35.length = 0.0;
        if ((Segment *)CONCAT44(uStack_5c4,local_5c8) != local_5b8) {
          SVar35 = local_5b8[0];
        }
        if ((ulong)SVar35 < (ulong)SVar1) goto LAB_0143e942;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_5c8,0,(char *)0x0,
                             (ulong)local_688.
                                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
      }
      else {
LAB_0143e942:
        puVar14 = (undefined8 *)
                  std::__cxx11::string::_M_append((char *)&local_688,CONCAT44(uStack_5c4,local_5c8))
        ;
      }
      local_1b0 = (undefined1  [8])local_1a0;
      paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 == paVar26) {
        local_1a0[0]._0_8_ = paVar26->_M_allocated_capacity;
        local_1a0[0]._8_8_ = puVar14[3];
      }
      else {
        local_1a0[0]._0_8_ = paVar26->_M_allocated_capacity;
        local_1b0 = (undefined1  [8])*puVar14;
      }
      local_1a8 = (_func_int **)puVar14[1];
      *puVar14 = paVar26;
      puVar14[1] = 0;
      paVar26->_M_local_buf[0] = '\0';
      plVar15 = (long *)std::__cxx11::string::append(local_1b0);
      local_330 = (undefined1  [8])(local_328 + 8);
      pTVar25 = (TestLog *)(plVar15 + 2);
      if ((TestLog *)*plVar15 == pTVar25) {
        local_320[0]._0_8_ = pTVar25->m_log;
        local_320[0]._8_8_ = plVar15[3];
      }
      else {
        local_320[0]._0_8_ = pTVar25->m_log;
        local_330 = (undefined1  [8])*plVar15;
      }
      local_328 = (undefined1  [8])plVar15[1];
      *plVar15 = (long)pTVar25;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      glu::checkError(dVar11,(char *)local_330,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                      ,0x10d);
      if (local_330 != (undefined1  [8])(local_328 + 8)) {
        operator_delete((void *)local_330,(ulong)(local_320[0]._M_allocated_capacity + 1));
      }
      if (local_1b0 != (undefined1  [8])local_1a0) {
        operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
      }
      if ((Segment *)CONCAT44(uStack_5c4,local_5c8) != local_5b8) {
        operator_delete((Segment *)CONCAT44(uStack_5c4,local_5c8),(long)local_5b8[0] + 1);
      }
      if (local_688.
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&local_688.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_688.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_688.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
      if (local_658.
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&local_658.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_658.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_658.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
      if ((pointer *)
          local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start !=
          &local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 1);
      }
      if (local_5a8 != &local_598) {
        operator_delete(local_5a8,CONCAT71(uStack_597,local_598) + 1);
      }
      if (lVar13 == 0) {
        pTVar23 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar23,(char *)0x0,"mappedData != DE_NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                   ,0x10e);
        __cxa_throw(pTVar23,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if (0 < (int)uVar48) {
        sVar16 = 0;
        do {
          pfVar28[sVar16] = *(float *)(lVar13 + sVar16 * 4);
          sVar16 = sVar16 + 1;
        } while (__n != sVar16);
      }
      (**(code **)(lVar41 + 0x1670))(0x8c8e);
      local_550 = (float)uVar48;
      std::vector<float,_std::allocator<float>_>::vector(&local_548,&local_528);
      if (local_528.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_528.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_528.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_528.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      SVar2 = local_5d0->m_spacing;
      if (SVar2 == SPACINGMODE_FRACTIONAL_EVEN) {
        fVar45 = 2.0;
LAB_0143ebd8:
        if (fVar45 <= fVar47) {
          fVar45 = fVar47;
        }
      }
      else if ((SVar2 == SPACINGMODE_FRACTIONAL_ODD) || (fVar45 = -1.0, SVar2 == SPACINGMODE_EQUAL))
      {
        fVar45 = 1.0;
        goto LAB_0143ebd8;
      }
      fVar46 = ceilf(fVar45);
      uVar31 = (uint)fVar46;
      pSVar29 = (Segment *)(ulong)uVar31;
      if (SVar2 == SPACINGMODE_FRACTIONAL_EVEN) {
        pSVar29 = (Segment *)(ulong)(uVar31 * 2 - (uVar31 - ((int)uVar31 >> 0x1f) & 0xfffffffe));
      }
      else if (SVar2 == SPACINGMODE_FRACTIONAL_ODD) {
        pSVar29 = (Segment *)(ulong)(uVar31 - ((int)uVar31 >> 0x1f) | 1);
      }
      std::vector<float,_std::allocator<float>_>::vector(&local_5f0,&local_548);
      pfVar6 = local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pfVar28 = local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar17 = (long)local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        lVar41 = 0x3f;
        if (uVar17 != 0) {
          for (; uVar17 >> lVar41 == 0; lVar41 = lVar41 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,((uint)lVar41 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pfVar28,pfVar6);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_500);
      std::ostream::_M_insert<double>((double)fVar47);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_500);
      std::ios_base::~ios_base(local_490);
      iVar8 = 0x1c;
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_658,0,(char *)0x0,0x1c8c090);
      local_688.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&local_688.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pSVar27 = (Segment *)(puVar14 + 2);
      if ((Segment *)*puVar14 == pSVar27) {
        local_688.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pSVar27;
        lStack_670 = puVar14[3];
      }
      else {
        local_688.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pSVar27;
        local_688.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_start = (Segment *)*puVar14;
      }
      local_688.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar14[1];
      *puVar14 = pSVar27;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_688);
      local_330 = (undefined1  [8])(local_328 + 8);
      paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 == paVar26) {
        local_320[0]._0_8_ = paVar26->_M_allocated_capacity;
        local_320[0]._8_8_ = puVar14[3];
      }
      else {
        local_320[0]._0_8_ = paVar26->_M_allocated_capacity;
        local_330 = (undefined1  [8])*puVar14;
      }
      local_328 = (undefined1  [8])puVar14[1];
      *puVar14 = paVar26;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      containerStr<std::vector<float,std::allocator<float>>>
                ((string *)local_500,(Functional *)&local_5f0,
                 (vector<float,_std::allocator<float>_> *)0x0,(int)paVar26,iVar8);
      uVar36 = (qpTestLog *)0xf;
      if (local_330 != (undefined1  [8])(local_328 + 8)) {
        uVar36 = local_320[0]._M_allocated_capacity;
      }
      if ((ulong)uVar36 < (qpTestLog *)((long)local_4f8 + (long)local_328)) {
        uVar36 = (qpTestLog *)0xf;
        if (local_500 != (undefined1  [8])(local_4f8 + 8)) {
          uVar36 = local_4f0[0]._M_allocated_capacity;
        }
        if ((ulong)uVar36 < (qpTestLog *)((long)local_4f8 + (long)local_328)) goto LAB_0143edfd;
        auVar37 = local_328;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)local_500,0,(char *)0x0,(ulong)local_330);
        iVar8 = SUB84(auVar37,0);
      }
      else {
LAB_0143edfd:
        auVar37 = local_328;
        puVar14 = (undefined8 *)std::__cxx11::string::_M_append(local_330,(ulong)local_500);
        iVar8 = SUB84(auVar37,0);
      }
      local_1b0 = (undefined1  [8])local_1a0;
      paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 == paVar26) {
        local_1a0[0]._0_8_ = paVar26->_M_allocated_capacity;
        local_1a0[0]._8_8_ = puVar14[3];
      }
      else {
        local_1a0[0]._0_8_ = paVar26->_M_allocated_capacity;
        local_1b0 = (undefined1  [8])*puVar14;
      }
      local_1a8 = (_func_int **)puVar14[1];
      *puVar14 = paVar26;
      puVar14[1] = 0;
      paVar26->_M_local_buf[0] = '\0';
      __n_01 = local_1a8;
      if (local_500 != (undefined1  [8])(local_4f8 + 8)) {
        __n_01 = (_func_int **)(local_4f0[0]._M_allocated_capacity + 1);
        operator_delete((void *)local_500,(ulong)__n_01);
      }
      if (local_330 != (undefined1  [8])(local_328 + 8)) {
        __n_01 = (_func_int **)(local_320[0]._M_allocated_capacity + 1);
        operator_delete((void *)local_330,(ulong)__n_01);
      }
      if (local_688.
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&local_688.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __n_01 = (_func_int **)
                 ((long)local_688.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        operator_delete(local_688.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_start,(ulong)__n_01);
      }
      if (local_658.
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&local_658.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __n_01 = (_func_int **)
                 ((long)local_658.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        operator_delete(local_658.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_start,(ulong)__n_01);
      }
      iVar10 = (int)pSVar29;
      if (iVar10 + 1 ==
          (int)((ulong)((long)local_548.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_548.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2)) {
        if ((((*local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != 0.0) ||
             (NAN(*local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start))) ||
            (local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish[-1] != 1.0)) ||
           (NAN(local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish[-1]))) {
          local_330 = (undefined1  [8])local_638;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_328,
                     "Failure: smallest coordinate should be 0.0 and biggest should be 1.0",0x44);
          local_500 = (undefined1  [8])
                      tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_330,
                                 (EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4f8,(char *)local_1b0,(long)local_1a8);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
          std::ios_base::~ios_base(local_488);
          goto LAB_0143f1b0;
        }
        if (iVar10 < 0) {
          std::__throw_length_error("cannot create std::vector larger than max_size()");
        }
        local_600 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                     *)(long)iVar10;
        pSVar18 = std::
                  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                  ::_M_allocate(local_600,(size_t)__n_01);
        uVar48 = SUB84(pSVar18,0);
        uVar50 = (undefined4)((ulong)pSVar18 >> 0x20);
        pSVar27 = (Segment *)0xbf800000ffffffff;
        p_Var19 = local_600;
        pSVar39 = pSVar18;
        if (iVar10 != 0) {
          do {
            pSVar39->index = -1;
            pSVar39->length = -1.0;
            pSVar39 = pSVar39 + 1;
            p_Var19 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                       *)((long)&p_Var19[-1]._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
          } while (p_Var19 !=
                   (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    *)0x0);
        }
        if (iVar10 != 0) {
          pSVar27 = (Segment *)&DAT_00000001;
          if (1 < iVar10) {
            pSVar27 = pSVar29;
          }
          pSVar29 = (Segment *)0x0;
          do {
            fVar47 = *(float *)((long)local_5f0.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start +
                               (long)((long)&pSVar29->index + 1) * 4);
            fVar46 = *(float *)((long)local_5f0.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start + (long)pSVar29 * 4);
            pSVar18[(long)pSVar29].index = (int)pSVar29;
            pSVar18[(long)pSVar29].length = fVar47 - fVar46;
            pSVar29 = (Segment *)((long)&pSVar29->index + 1);
          } while (pSVar27 != pSVar29);
        }
        uVar17 = (long)pSVar39 - (long)pSVar18;
        pLVar42 = (LineData *)((long)uVar17 >> 3);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&local_688,(size_type)pLVar42,
                   (allocator_type *)&local_658);
        uVar31 = (uint)(uVar17 >> 3);
        if (0 < (int)uVar31) {
          uVar20 = 0;
          do {
            *(undefined4 *)
             ((long)&(local_688.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_start)->index + uVar20 * 4) =
                 *(undefined4 *)(CONCAT44(uVar50,uVar48) + 4 + uVar20 * 8);
            uVar20 = uVar20 + 1;
            pSVar27 = local_688.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          } while ((uVar31 & 0x7fffffff) != uVar20);
        }
        containerStr<std::vector<float,std::allocator<float>>>
                  ((string *)local_330,(Functional *)&local_688,
                   (vector<float,_std::allocator<float>_> *)0x0,(int)pSVar27,iVar8);
        plVar15 = (long *)std::__cxx11::string::replace((ulong)local_330,0,(char *)0x0,0x1c8c1cd);
        local_500 = (undefined1  [8])(local_4f8 + 8);
        pTVar25 = (TestLog *)(plVar15 + 2);
        if ((TestLog *)*plVar15 == pTVar25) {
          local_4f0[0]._0_8_ = pTVar25->m_log;
          local_4f0[0]._8_8_ = plVar15[3];
        }
        else {
          local_4f0[0]._0_8_ = pTVar25->m_log;
          local_500 = (undefined1  [8])*plVar15;
        }
        local_4f8 = (undefined1  [8])plVar15[1];
        *plVar15 = (long)pTVar25;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::_M_append(local_1b0,(ulong)local_500);
        if (local_500 != (undefined1  [8])(local_4f8 + 8)) {
          operator_delete((void *)local_500,(ulong)(local_4f0[0]._M_allocated_capacity + 1));
        }
        if (local_330 != (undefined1  [8])(local_328 + 8)) {
          operator_delete((void *)local_330,(ulong)(local_320[0]._M_allocated_capacity + 1));
        }
        if (local_688.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
            ._M_impl.super__Vector_impl_data._M_start != (Segment *)0x0) {
          operator_delete(local_688.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_688.
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_688.
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        local_688.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_688.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_start = (Segment *)0x0;
        local_688.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_finish = (Segment *)0x0;
        local_658.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_658.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_start = (Segment *)0x0;
        local_658.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_finish = (Segment *)0x0;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ::push_back(&local_688,(value_type *)CONCAT44(uVar50,uVar48));
        local_608 = pLVar42;
        if (1 < (int)(uint)pLVar42) {
          lVar41 = (ulong)((uint)pLVar42 & 0x7fffffff) - 1;
          pvVar4 = (value_type *)CONCAT44(uVar50,uVar48);
          do {
            pSVar18 = local_658.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pSVar39 = local_688.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            fVar46 = pvVar4[1].length -
                     (local_688.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_start)->length;
            fVar47 = -fVar46;
            if (-fVar46 <= fVar46) {
              fVar47 = fVar46;
            }
            this_00 = &local_688;
            if ((0.001 <= fVar47) &&
               (this_00 = &local_658,
               local_658.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_658.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
               ._M_impl.super__Vector_impl_data._M_finish)) {
              fVar46 = pvVar4[1].length -
                       (local_658.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_start)->length;
              fVar47 = -fVar46;
              if (-fVar46 <= fVar46) {
                fVar47 = fVar46;
              }
              if (0.001 <= fVar47) {
                local_330 = (undefined1  [8])local_638;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_328,
                           "Failure: couldn\'t divide segments to 2 groups by length; ",0x39);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_328,"e.g. segment of length ",0x17);
                std::ostream::_M_insert<double>((double)pvVar4[1].length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_328," isn\'t approximately equal to either ",0x25);
                std::ostream::_M_insert<double>((double)pSVar39->length);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328," or ",4);
                std::ostream::_M_insert<double>((double)pSVar18->length);
                local_500 = (undefined1  [8])
                            tcu::MessageBuilder::operator<<
                                      ((MessageBuilder *)local_330,
                                       (EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4f8,(char *)local_1b0,(long)local_1a8);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
                std::ios_base::~ios_base(local_488);
                goto LAB_0143fb5e;
              }
            }
            std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
            ::push_back(this_00,pvVar4 + 1);
            lVar41 = lVar41 + -1;
            pvVar4 = pvVar4 + 1;
          } while (lVar41 != 0);
        }
        pSVar5 = local_688.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pSVar18 = local_688.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pSVar39 = local_688.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((fVar45 != (float)iVar10) || (NAN(fVar45) || NAN((float)iVar10))) ||
           ((local_688.
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_688.
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
             ._M_impl.super__Vector_impl_data._M_finish ||
            (local_658.
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_658.
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
             ._M_impl.super__Vector_impl_data._M_finish)))) {
          if ((local_688.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_688.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
               ._M_impl.super__Vector_impl_data._M_finish) &&
             (local_658.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_658.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
              ._M_impl.super__Vector_impl_data._M_finish)) {
            if (((long)local_688.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_688.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                       ._M_impl.super__Vector_impl_data._M_start != 0x10) &&
               ((long)local_658.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_658.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_start != 0x10)) {
              local_330 = (undefined1  [8])local_638;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_328,
                         "Failure: when dividing the segments to 2 groups by length, neither of the two groups has exactly 2 or 0 segments in it"
                         ,0x76);
              local_500 = (undefined1  [8])
                          tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)local_330,
                                     (EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4f8,(char *)local_1b0,(long)local_1a8);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage);
              goto LAB_0143f723;
            }
            if ((long)local_658.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_658.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_start != 0x10) {
              local_688.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   local_658.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_688.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_658.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_688.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   local_658.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_658.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
              ._M_impl.super__Vector_impl_data._M_start = pSVar39;
              local_658.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
              ._M_impl.super__Vector_impl_data._M_finish = pSVar18;
              local_658.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar5;
            }
            pSVar5 = local_688.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pSVar18 = local_688.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pSVar39 = local_688.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((long)local_688.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_688.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_start == 0x10) {
              if ((local_688.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                   ._M_impl.super__Vector_impl_data._M_start)->length <
                  (local_658.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                   ._M_impl.super__Vector_impl_data._M_start)->length) {
                local_688.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     local_658.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_688.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_658.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_688.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     local_658.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_658.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                ._M_impl.super__Vector_impl_data._M_start = pSVar39;
                local_658.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                ._M_impl.super__Vector_impl_data._M_finish = pSVar18;
                local_658.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar5;
              }
            }
            else if ((local_688.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_start)->length + 0.001 <
                     (local_658.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_start)->length) {
              local_330 = (undefined1  [8])local_638;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_328,
                         "Failure: the two additional segments are longer than the other segments",
                         0x47);
              local_500 = (undefined1  [8])
                          tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)local_330,
                                     (EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4f8,(char *)local_1b0,(long)local_1a8);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage);
              goto LAB_0143f723;
            }
            pSVar39 = local_658.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            fVar47 = (float)(local_658.
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                             ._M_impl.super__Vector_impl_data._M_start)->index;
            fVar45 = (float)local_658.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].index;
            iVar8 = (int)local_608;
            if ((int)fVar47 + (int)fVar45 + 1 == iVar8) {
              fVar46 = (local_658.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_start)->length;
              if ((((long)local_688.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_688.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                          ._M_impl.super__Vector_impl_data._M_start != 0x10) ||
                  (local_5c8 = -NAN,
                  fVar46 < (local_688.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                            ._M_impl.super__Vector_impl_data._M_start)->length + -0.001)) &&
                 (local_5c8 = fVar45, (int)fVar47 < (int)fVar45)) {
                local_5c8 = fVar47;
              }
              goto LAB_0143f77e;
            }
            local_330 = (undefined1  [8])local_638;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_328,
                       "Failure: the two additional segments aren\'t placed symmetrically; ",0x42);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_328,"one is at index ",0x10);
            std::ostream::operator<<((ostringstream *)local_328,pSVar39->index);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_328," and other is at index ",0x17);
            std::ostream::operator<<((ostringstream *)local_328,pSVar39[1].index);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_328," (note: the two indexes should sum to ",0x26);
            std::ostream::operator<<((ostringstream *)local_328,iVar8 + -1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_328,", i.e. numberOfSegments-1)",0x1a);
            local_500 = (undefined1  [8])
                        tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_330,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4f8,(char *)local_1b0,(long)local_1a8);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
            std::ios_base::~ios_base(local_488);
            goto LAB_0143fb5e;
          }
          fVar46 = -1.0;
          if (uVar17 != 8) {
            fVar46 = *(float *)(CONCAT44(uVar50,uVar48) + 4);
          }
          local_5c8 = -NAN;
LAB_0143f77e:
          local_5a8 = (undefined1 *)CONCAT44(local_5a8._4_4_,fVar46);
          bVar44 = true;
        }
        else {
          local_330 = (undefined1  [8])local_638;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_328,
                     "Failure: clamped and final tessellation level are equal, but not all segments are of equal length."
                     ,0x62);
          local_500 = (undefined1  [8])
                      tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_330,
                                 (EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4f8,(char *)local_1b0,(long)local_1a8);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0143f723:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
          std::ios_base::~ios_base(local_488);
LAB_0143fb5e:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
          std::ios_base::~ios_base(local_2b8);
          bVar44 = false;
        }
        if (local_658.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
            ._M_impl.super__Vector_impl_data._M_start != (Segment *)0x0) {
          operator_delete(local_658.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_658.
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_658.
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_688.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
            ._M_impl.super__Vector_impl_data._M_start != (Segment *)0x0) {
          operator_delete(local_688.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_688.
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_688.
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        __n_00._M_current = (int *)((long)local_600 << 3);
        operator_delete((void *)CONCAT44(uVar50,uVar48),(ulong)__n_00._M_current);
      }
      else {
        local_330 = (undefined1  [8])local_638;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_328,"Failure: number of vertices is ",0x1f);
        std::ostream::_M_insert<unsigned_long>((ulong)local_328);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"; expected ",0xb);
        std::ostream::operator<<((ostringstream *)local_328,iVar10 + 1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_328," (clamped tessellation level is ",0x20);
        std::ostream::_M_insert<double>((double)fVar45);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,")",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_328,"; final level (clamped level rounded up to ",0x2b);
        pcVar30 = "odd";
        if (SVar2 == SPACINGMODE_FRACTIONAL_EVEN) {
          pcVar30 = "even";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_328,pcVar30,(ulong)(SVar2 == SPACINGMODE_FRACTIONAL_EVEN) + 3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,") is ",5);
        std::ostream::operator<<(local_328,iVar10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_328,
                   " and should equal the number of segments, i.e. number of vertices minus 1",0x49)
        ;
        local_500 = (undefined1  [8])
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_330,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4f8,(char *)local_1b0,(long)local_1a8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
        std::ios_base::~ios_base(local_488);
LAB_0143f1b0:
        __n_00._M_current = (int *)&std::__cxx11::ostringstream::VTT;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
        std::ios_base::~ios_base(local_2b8);
        bVar44 = false;
      }
      if (local_1b0 != (undefined1  [8])local_1a0) {
        __n_00._M_current = (int *)(local_1a0[0]._M_allocated_capacity + 1);
        operator_delete((void *)local_1b0,(ulong)__n_00._M_current);
      }
      if ((pointer *)
          local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer *)0x0) {
        __n_00._M_current =
             (int *)((long)local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage -
                    (long)local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
        operator_delete(local_5f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,(ulong)__n_00._M_current);
      }
      if (!bVar44) {
        if (local_548.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          __n_00._M_current =
               (int *)((long)local_548.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage -
                      (long)local_548.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          operator_delete(local_548.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,(ulong)__n_00._M_current);
        }
        goto LAB_0143fbdc;
      }
      if (iStack_560._M_current == local_558) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)&local_568,iStack_560,(float *)&local_5a8)
        ;
      }
      else {
        *iStack_560._M_current = local_5a8._0_4_;
        iStack_560._M_current = iStack_560._M_current + 1;
      }
      if (iStack_580._M_current == local_578) {
        __n_00._M_current = iStack_580._M_current;
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_588,iStack_580,(int *)&local_5c8);
      }
      else {
        *iStack_580._M_current = (int)local_5c8;
        __n_00._M_current = iStack_580._M_current + 1;
        iStack_580._M_current = __n_00._M_current;
      }
      if (local_548.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        __n_00._M_current =
             (int *)((long)local_548.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage -
                    (long)local_548.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
        operator_delete(local_548.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,(ulong)__n_00._M_current);
      }
      if ((!bVar44) ||
         (lVar41 = local_660 + 1,
         (int)((ulong)((long)local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2) <= lVar41)) goto LAB_0143fbdc;
    } while( true );
  }
  bVar44 = true;
LAB_0143fbdc:
  if (bVar44 != false) {
    local_5f8 = CONCAT44(local_5f8._4_4_,local_5d0->m_spacing);
    if ((int)((ulong)((long)local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2) < 1) {
      pLVar32 = (pointer)0x0;
      pLVar49 = (pointer)0x0;
      pLVar21 = (pointer)0x0;
    }
    else {
      pLVar32 = (pointer)0x0;
      pLVar49 = (pointer)0x0;
      lVar41 = 0;
      pLVar43 = (pointer)0x0;
      do {
        fVar47 = local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar41];
        fVar45 = *(float *)((long)local_568 + lVar41 * 4);
        iVar8 = *(int *)((long)local_588 + lVar41 * 4);
        if (pLVar32 == pLVar49) {
          local_660 = CONCAT44(local_660._4_4_,fVar45);
          lVar13 = (long)pLVar32 - (long)pLVar43;
          if (lVar13 == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar20 = (lVar13 >> 2) * -0x5555555555555555;
          uVar17 = uVar20;
          if (pLVar32 == pLVar43) {
            uVar17 = 1;
          }
          this_01 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
                     *)(uVar17 + uVar20);
          if ((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
               *)0xaaaaaaaaaaaaaa9 < this_01) {
            this_01 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
                       *)0xaaaaaaaaaaaaaaa;
          }
          if (CARRY8(uVar17,uVar20)) {
            this_01 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
                       *)0xaaaaaaaaaaaaaaa;
          }
          pLVar21 = std::
                    _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
                    ::_M_allocate(this_01,(size_t)__n_00._M_current);
          *(float *)((long)pLVar21 + lVar13) = fVar47;
          *(float *)((long)pLVar21 + lVar13 + 4) = (float)local_660;
          *(int *)((long)pLVar21 + lVar13 + 8) = iVar8;
          pLVar40 = pLVar21;
          for (pLVar22 = pLVar43; pLVar32 != pLVar22; pLVar22 = pLVar22 + 1) {
            pLVar40->additionalSegmentLocation = pLVar22->additionalSegmentLocation;
            fVar47 = pLVar22->additionalSegmentLength;
            pLVar40->tessLevel = pLVar22->tessLevel;
            pLVar40->additionalSegmentLength = fVar47;
            pLVar40 = pLVar40 + 1;
          }
          if (pLVar43 != (pointer)0x0) {
            __n_00._M_current = (int *)((long)pLVar49 - (long)pLVar43);
            operator_delete(pLVar43,(ulong)__n_00._M_current);
          }
          pLVar49 = pLVar21 + (long)this_01;
        }
        else {
          pLVar32->tessLevel = fVar47;
          pLVar32->additionalSegmentLength = fVar45;
          pLVar32->additionalSegmentLocation = iVar8;
          pLVar40 = pLVar32;
          pLVar21 = pLVar43;
        }
        pLVar32 = pLVar40 + 1;
        lVar41 = lVar41 + 1;
        pLVar43 = pLVar21;
      } while (lVar41 < (int)((ulong)((long)local_628.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_628.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start) >> 2));
    }
    local_530 = (long)pLVar32 - (long)pLVar21;
    __first._M_current =
         std::
         _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
         ::_M_allocate((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
                        *)(((long)local_530 >> 2) * -0x5555555555555555),(size_t)__n_00._M_current);
    __last._M_current = __first._M_current;
    for (pLVar43 = pLVar21; pLVar43 != pLVar32; pLVar43 = pLVar43 + 1) {
      (__last._M_current)->additionalSegmentLocation = pLVar43->additionalSegmentLocation;
      fVar47 = pLVar43->additionalSegmentLength;
      (__last._M_current)->tessLevel = pLVar43->tessLevel;
      (__last._M_current)->additionalSegmentLength = fVar47;
      __last._M_current = __last._M_current + 1;
    }
    if (__first._M_current != __last._M_current) {
      uVar17 = ((long)__last._M_current - (long)__first._M_current >> 2) * -0x5555555555555555;
      lVar41 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar41 == 0; lVar41 = lVar41 + -1) {
        }
      }
      __comp._M_comp._8_4_ = (int)pLVar49;
      __comp._M_comp.m_membP = in_stack_fffffffffffff958;
      __comp._M_comp._12_4_ = (int)((ulong)pLVar49 >> 0x20);
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::MemberPred<std::less<float>,deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,float>>>
                (__first,__last,(ulong)(((uint)lVar41 ^ 0x3f) * 2) ^ 0x7e,__comp);
      uVar48 = (undefined4)((ulong)pLVar49 >> 0x20);
      if ((long)__last._M_current - (long)__first._M_current < 0xc1) {
        __comp_01._M_comp._8_4_ = (int)pLVar49;
        __comp_01._M_comp.m_membP = in_stack_fffffffffffff958;
        __comp_01._M_comp._12_4_ = uVar48;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>>>,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::MemberPred<std::less<float>,deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,float>>>
                  (__first,__last,__comp_01);
      }
      else {
        __last_00._M_current = __first._M_current + 0x10;
        __comp_00._M_comp._8_4_ = (int)pLVar49;
        __comp_00._M_comp.m_membP = in_stack_fffffffffffff958;
        __comp_00._M_comp._12_4_ = uVar48;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>>>,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::MemberPred<std::less<float>,deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,float>>>
                  (__first,__last_00,__comp_00);
        for (; __last_00._M_current != __last._M_current;
            __last_00._M_current = __last_00._M_current + 1) {
          fVar47 = (__last_00._M_current)->tessLevel;
          fVar46 = (__last_00._M_current)->additionalSegmentLength;
          iVar8 = (__last_00._M_current)->additionalSegmentLocation;
          fVar45 = __last_00._M_current[-1].tessLevel;
          pLVar42 = __last_00._M_current;
          while (fVar47 < fVar45) {
            pLVar42->additionalSegmentLocation = pLVar42[-1].additionalSegmentLocation;
            fVar45 = pLVar42[-1].additionalSegmentLength;
            pLVar42->tessLevel = pLVar42[-1].tessLevel;
            pLVar42->additionalSegmentLength = fVar45;
            fVar45 = pLVar42[-2].tessLevel;
            pLVar42 = pLVar42 + -1;
          }
          pLVar42->tessLevel = fVar47;
          pLVar42->additionalSegmentLength = fVar46;
          pLVar42->additionalSegmentLocation = iVar8;
        }
      }
    }
    uVar31 = (int)((long)__last._M_current - (long)__first._M_current >> 2) * -0x55555555;
    local_608 = __first._M_current;
    if (1 < (int)uVar31) {
      lVar41 = (ulong)(uVar31 & 0x7fffffff) - 1;
      piVar33 = &__first._M_current[1].additionalSegmentLocation;
      do {
        iVar8 = 7;
        if ((-1 < *piVar33) && (-1 < piVar33[-3])) {
          if ((int)local_5f8 == 2) {
            fVar47 = 2.0;
LAB_0143ff35:
            if (fVar47 <= ((LineData *)(piVar33 + -2))->tessLevel) {
              fVar47 = ((LineData *)(piVar33 + -2))->tessLevel;
            }
          }
          else if (((int)local_5f8 == 1) || (fVar47 = -1.0, (int)local_5f8 == 0)) {
            fVar47 = 1.0;
            goto LAB_0143ff35;
          }
          if ((int)local_5f8 == 2) {
            fVar45 = 2.0;
LAB_0143ff66:
            if (fVar45 <= (float)piVar33[-5]) {
              fVar45 = (float)piVar33[-5];
            }
          }
          else if (((int)local_5f8 == 1) || (fVar45 = -1.0, (int)local_5f8 == 0)) {
            fVar45 = 1.0;
            goto LAB_0143ff66;
          }
          iVar8 = 0;
          if (*piVar33 != piVar33[-3]) {
            iVar8 = 0;
            if ((fVar47 == fVar45) && (!NAN(fVar47) && !NAN(fVar45))) {
              local_330 = (undefined1  [8])local_638;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_328,
                         "Failure: additional segments not located identically for two edges with identical clamped tessellation levels"
                         ,0x6d);
              local_500 = (undefined1  [8])
                          tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)local_330,
                                     (EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4f8,"Note: tessellation levels are ",0x1e);
              iVar8 = (int)local_5f8;
              std::ostream::_M_insert<double>((double)((LineData *)(piVar33 + -2))->tessLevel);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8," and ",5);
              std::ostream::_M_insert<double>((double)(float)piVar33[-5]);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4f8," (clamped level ",0x10);
              if (iVar8 == 2) {
                fVar47 = 2.0;
LAB_01440066:
                if (fVar47 <= ((LineData *)(piVar33 + -2))->tessLevel) {
                  fVar47 = ((LineData *)(piVar33 + -2))->tessLevel;
                }
              }
              else if ((iVar8 == 1) || (fVar47 = -1.0, iVar8 == 0)) {
                fVar47 = 1.0;
                goto LAB_01440066;
              }
              std::ostream::_M_insert<double>((double)fVar47);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,")",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4f8,"; but first additional segments located at indices ",
                         0x33);
              std::ostream::operator<<((ostringstream *)local_4f8,*piVar33);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8," and ",5);
              std::ostream::operator<<((ostringstream *)local_4f8,piVar33[-3]);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4f8,", respectively",0xe);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
              std::ios_base::~ios_base(local_488);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
              std::ios_base::~ios_base(local_2b8);
              iVar8 = 1;
            }
          }
        }
        if ((iVar8 != 7) && (iVar8 != 0)) goto LAB_0144014f;
        piVar33 = piVar33 + 3;
        lVar41 = lVar41 + -1;
      } while (lVar41 != 0);
    }
    iVar8 = 5;
LAB_0144014f:
    if (iVar8 == 5) {
      if (1 < (int)uVar31) {
        lVar41 = (ulong)(uVar31 & 0x7fffffff) - 1;
        pfVar24 = &local_608[1].additionalSegmentLength;
        iVar8 = (int)local_5f8;
        do {
          iVar10 = 10;
          if ((0.0 <= *pfVar24) && (0.0 <= pfVar24[-3])) {
            if (iVar8 == 2) {
              local_694 = 2.0;
LAB_014401de:
              if (local_694 <= ((LineData *)(pfVar24 + -1))->tessLevel) {
                local_694 = ((LineData *)(pfVar24 + -1))->tessLevel;
              }
            }
            else if ((iVar8 == 1) || (local_694 = -1.0, iVar8 == 0)) {
              local_694 = 1.0;
              goto LAB_014401de;
            }
            local_600 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                         *)CONCAT44(local_600._4_4_,pfVar24[-3]);
            if (iVar8 == 2) {
              fVar47 = 2.0;
LAB_01440225:
              if (fVar47 <= pfVar24[-4]) {
                fVar47 = pfVar24[-4];
              }
              local_660 = CONCAT44(local_660._4_4_,fVar47);
            }
            else {
              if (iVar8 == 1) {
LAB_01440213:
                fVar47 = 1.0;
                goto LAB_01440225;
              }
              local_660 = CONCAT44(local_660._4_4_,0xbf800000);
              if (iVar8 == 0) goto LAB_01440213;
            }
            local_62c = *pfVar24;
            fVar47 = ceilf(local_694);
            uVar31 = (uint)fVar47;
            if (iVar8 == 2) {
              uVar31 = uVar31 + (int)uVar31 % 2;
            }
            else if (iVar8 == 1) {
              uVar31 = uVar31 - ((int)uVar31 >> 0x1f) | 1;
            }
            fVar47 = ceilf((float)local_660);
            uVar38 = (uint)fVar47;
            if (iVar8 == 2) {
              uVar38 = uVar38 + (int)uVar38 % 2;
            }
            else if (iVar8 == 1) {
              uVar38 = uVar38 - ((int)uVar38 >> 0x1f) | 1;
            }
            if (uVar31 == uVar38) {
              if (local_600._0_4_ <= local_62c) {
                if ((local_62c != local_600._0_4_) ||
                   (iVar10 = 0, NAN(local_62c) || NAN(local_600._0_4_))) {
                  iVar10 = 0;
                  if ((local_694 == (float)local_660) && (!NAN(local_694) && !NAN((float)local_660))
                     ) goto LAB_0144030d;
                }
              }
              else {
LAB_0144030d:
                local_1b0 = (undefined1  [8])local_638;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,
                           "Failure: additional segment length isn\'t monotonically decreasing with the fraction <n> - <f>, among edges with same final tessellation level"
                           ,0x8d);
                local_330 = (undefined1  [8])
                            tcu::MessageBuilder::operator<<
                                      ((MessageBuilder *)local_1b0,
                                       (EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_328,
                           "Note: <f> stands for the clamped tessellation level and <n> for the final (rounded and clamped) tessellation level"
                           ,0x72);
                local_500 = (undefined1  [8])
                            tcu::MessageBuilder::operator<<
                                      ((MessageBuilder *)local_330,
                                       (EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4f8,"Note: two edges have tessellation levels ",0x29);
                std::ostream::_M_insert<double>((double)pfVar24[-4]);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8," and ",5);
                std::ostream::_M_insert<double>((double)((LineData *)(pfVar24 + -1))->tessLevel);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4f8," respectively",0xd);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4f8,", clamped ",10);
                std::ostream::_M_insert<double>((double)(float)local_660);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8," and ",5);
                std::ostream::_M_insert<double>((double)local_694);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4f8,", final ",8);
                std::ostream::operator<<((ostringstream *)local_4f8,uVar38);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8," and ",5);
                std::ostream::operator<<((ostringstream *)local_4f8,uVar31);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4f8,"; fractions are ",0x10);
                std::ostream::_M_insert<double>((double)((float)(int)uVar38 - (float)local_660));
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8," and ",5);
                std::ostream::_M_insert<double>((double)((float)(int)uVar31 - local_694));
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4f8,", but resulted in segment lengths ",0x22);
                std::ostream::_M_insert<double>((double)pfVar24[-3]);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8," and ",5);
                std::ostream::_M_insert<double>((double)*pfVar24);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
                std::ios_base::~ios_base(local_488);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
                std::ios_base::~ios_base(local_2b8);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
                std::ios_base::~ios_base(local_138);
                iVar10 = 1;
              }
            }
          }
          if ((iVar10 != 10) && (iVar10 != 0)) goto LAB_014405d1;
          pfVar24 = pfVar24 + 3;
          lVar41 = lVar41 + -1;
        } while (lVar41 != 0);
      }
      iVar10 = 8;
LAB_014405d1:
      iVar8 = 0;
      if (iVar10 != 8) {
        iVar8 = iVar10;
      }
    }
    if (local_608 != (LineData *)0x0) {
      operator_delete(local_608,local_530);
    }
    if (pLVar21 != (pointer)0x0) {
      operator_delete(pLVar21,(long)pLVar49 - (long)pLVar21);
    }
    bVar44 = iVar8 == 0;
  }
  pcVar30 = "Invalid tessellation coordinates";
  if (bVar44 != false) {
    pcVar30 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((local_5d0->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar44 ^ 1),
             pcVar30);
  glu::ObjectWrapper::~ObjectWrapper(&local_348);
  glu::ObjectWrapper::~ObjectWrapper(&local_360);
  glu::ObjectWrapper::~ObjectWrapper(&local_378);
  if (local_588 != (void *)0x0) {
    operator_delete(local_588,(long)local_578 - (long)local_588);
  }
  if (local_568 != (void *)0x0) {
    operator_delete(local_568,(long)local_558 - (long)local_568);
  }
  if (local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_628.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

FractionalSpacingModeCase::IterateResult FractionalSpacingModeCase::iterate (void)
{
	typedef TransformFeedbackHandler<float> TFHandler;

	TestLog&						log							= m_testCtx.getLog();
	const RenderContext&			renderCtx					= m_context.getRenderContext();
	const RandomViewport			viewport					(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32					programGL					= m_program->getProgram();
	const glw::Functions&			gl							= renderCtx.getFunctions();

	const int						tessLevelOuter1Loc			= gl.getUniformLocation(programGL, "u_tessLevelOuter1");

	// Second outer tessellation levels.
	const vector<float>				tessLevelCases				= genTessLevelCases();
	const int						maxNumVertices				= 1 + getClampedRoundedTessLevel(m_spacing, *std::max_element(tessLevelCases.begin(), tessLevelCases.end()));
	vector<float>					additionalSegmentLengths;
	vector<int>						additionalSegmentLocations;

	const TFHandler					tfHandler					(m_context.getRenderContext(), maxNumVertices);

	bool							success						= true;

	setViewport(gl, viewport);
	gl.useProgram(programGL);

	gl.patchParameteri(GL_PATCH_VERTICES, 1);

	for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < (int)tessLevelCases.size(); tessLevelCaseNdx++)
	{
		const float outerLevel1 = tessLevelCases[tessLevelCaseNdx];

		gl.uniform1f(tessLevelOuter1Loc, outerLevel1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Setup failed");

		{
			const TFHandler::Result		tfResult = tfHandler.renderAndGetPrimitives(programGL, GL_POINTS, 0, DE_NULL, 1);
			float						additionalSegmentLength;
			int							additionalSegmentLocation;

			success = verifyFractionalSpacingSingle(log, m_spacing, outerLevel1, tfResult.varying,
													additionalSegmentLength, additionalSegmentLocation);

			if (!success)
				break;

			additionalSegmentLengths.push_back(additionalSegmentLength);
			additionalSegmentLocations.push_back(additionalSegmentLocation);
		}
	}

	if (success)
		success = verifyFractionalSpacingMultiple(log, m_spacing, tessLevelCases, additionalSegmentLengths, additionalSegmentLocations);

	m_testCtx.setTestResult(success ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, success ? "Pass" : "Invalid tessellation coordinates");
	return STOP;
}